

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O1

void threads_stop(lzma_stream_coder_conflict1 *coder,_Bool wait_for_threads)

{
  worker_thread *pwVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  
  if (coder->threads_initialized != 0) {
    uVar4 = 0;
    do {
      bVar2 = true;
      while( true ) {
        if (bVar2) {
          iVar3 = pthread_mutex_lock((pthread_mutex_t *)&coder->threads[uVar4].mutex);
          if (iVar3 != 0) goto LAB_001a538f;
        }
        else {
          iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&coder->threads[uVar4].mutex);
          if (iVar3 != 0) goto LAB_001a53ae;
        }
        if (!bVar2) break;
        pwVar1 = coder->threads;
        pwVar1[uVar4].state = THR_STOP;
        iVar3 = pthread_cond_signal((pthread_cond_t *)&pwVar1[uVar4].cond);
        bVar2 = false;
        if (iVar3 != 0) {
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0x10c,"void mythread_cond_signal(mythread_cond *)");
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < coder->threads_initialized);
  }
  if ((!wait_for_threads) || (coder->threads_initialized == 0)) {
    return;
  }
  uVar4 = 0;
LAB_001a52b3:
  bVar2 = true;
  do {
    if (bVar2) {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&coder->threads[uVar4].mutex);
      if (iVar3 != 0) {
LAB_001a538f:
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
      }
    }
    else {
      iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&coder->threads[uVar4].mutex);
      if (iVar3 != 0) {
LAB_001a53ae:
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
      }
    }
    if (!bVar2) break;
    while (pwVar1 = coder->threads, pwVar1[uVar4].state != THR_IDLE) {
      iVar3 = pthread_cond_wait((pthread_cond_t *)&pwVar1[uVar4].cond,
                                (pthread_mutex_t *)&pwVar1[uVar4].mutex);
      if (iVar3 != 0) {
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0x114,"void mythread_cond_wait(mythread_cond *, mythread_mutex *)");
      }
    }
    bVar2 = false;
  } while( true );
  uVar4 = uVar4 + 1;
  if (coder->threads_initialized <= uVar4) {
    return;
  }
  goto LAB_001a52b3;
}

Assistant:

static void
threads_stop(lzma_stream_coder *coder, bool wait_for_threads)
{
	// Tell the threads to stop.
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			coder->threads[i].state = THR_STOP;
			mythread_cond_signal(&coder->threads[i].cond);
		}
	}

	if (!wait_for_threads)
		return;

	// Wait for the threads to settle in the idle state.
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			while (coder->threads[i].state != THR_IDLE)
				mythread_cond_wait(&coder->threads[i].cond,
						&coder->threads[i].mutex);
		}
	}

	return;
}